

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

uint64_t __thiscall
spvtools::opt::ScalarReplacementPass::GetNumElements(ScalarReplacementPass *this,Instruction *type)

{
  uint **ppuVar1;
  Operand *pOVar2;
  uint64_t uVar3;
  byte bVar4;
  size_t sVar5;
  uint **ppuVar6;
  size_t i;
  size_t sVar7;
  
  if (1 < type->opcode_ - OpTypeVector) {
    __assert_fail("type->opcode() == spv::Op::OpTypeVector || type->opcode() == spv::Op::OpTypeMatrix"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                  ,0x243,
                  "uint64_t spvtools::opt::ScalarReplacementPass::GetNumElements(const Instruction *) const"
                 );
  }
  pOVar2 = Instruction::GetInOperand(type,1);
  ppuVar1 = (uint **)(pOVar2->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  if (ppuVar1 == (uint **)0x0) {
    sVar5 = (pOVar2->words).size_;
  }
  else {
    sVar5 = (long)*(pointer *)
                   &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar1 + 1))->
                    _M_impl - (long)*ppuVar1 >> 2;
  }
  if (sVar5 < 3) {
    ppuVar6 = &(pOVar2->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar6 = ppuVar1;
    }
    bVar4 = 0;
    uVar3 = 0;
    sVar5 = 0;
    while( true ) {
      sVar7 = (pOVar2->words).size_;
      if (ppuVar1 != (uint **)0x0) {
        sVar7 = (long)*(pointer *)
                       &((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)(ppuVar1 + 1))
                        ->_M_impl - (long)*ppuVar1 >> 2;
      }
      if (sVar5 == sVar7) break;
      uVar3 = uVar3 | (ulong)(*ppuVar6)[sVar5] << (bVar4 & 0x3f);
      sVar5 = sVar5 + 1;
      bVar4 = bVar4 + 0x20;
    }
    return uVar3;
  }
  __assert_fail("op.words.size() <= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x245,
                "uint64_t spvtools::opt::ScalarReplacementPass::GetNumElements(const Instruction *) const"
               );
}

Assistant:

uint64_t ScalarReplacementPass::GetNumElements(const Instruction* type) const {
  assert(type->opcode() == spv::Op::OpTypeVector ||
         type->opcode() == spv::Op::OpTypeMatrix);
  const Operand& op = type->GetInOperand(1u);
  assert(op.words.size() <= 2);
  uint64_t len = 0;
  for (size_t i = 0; i != op.words.size(); ++i) {
    len |= (static_cast<uint64_t>(op.words[i]) << (32ull * i));
  }
  return len;
}